

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_light.cpp
# Opt level: O2

double __thiscall ON_Light::Attenuation(ON_Light *this,double d)

{
  double dVar1;
  
  dVar1 = ((this->m_attenuation).z * d + (this->m_attenuation).y) * d + (this->m_attenuation).x;
  return (double)(-(ulong)(0.0 < dVar1) & (ulong)(1.0 / dVar1));
}

Assistant:

double ON_Light::Attenuation(double d) const
{
  // computes 1/(a[0] + d*a[1] + d^2*a[2]) where d = argument
  // returns 0 if a[0] + d*a[1] + d^2*a[2] <= 0
  double a = m_attenuation.x + d*(m_attenuation.y + d*m_attenuation.z);
  if ( a > 0.0 )
    a = 1.0/a;
  else
    a = 0.0;
  return a;
}